

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

ssize_t Curl_bufq_read(bufq *q,uchar *buf,size_t len,CURLcode *err)

{
  size_t sVar1;
  bool bVar2;
  size_t n;
  ssize_t nread;
  CURLcode *err_local;
  size_t len_local;
  uchar *buf_local;
  bufq *q_local;
  
  n = 0;
  *err = CURLE_OK;
  err_local = (CURLcode *)len;
  len_local = (size_t)buf;
  while( true ) {
    bVar2 = false;
    if (err_local != (CURLcode *)0x0) {
      bVar2 = q->head != (buf_chunk *)0x0;
    }
    if (!bVar2) break;
    sVar1 = chunk_read(q->head,(uchar *)len_local,(size_t)err_local);
    if (sVar1 != 0) {
      n = sVar1 + n;
      len_local = sVar1 + len_local;
      err_local = (CURLcode *)((long)err_local - sVar1);
    }
    prune_head(q);
  }
  if (n == 0) {
    *err = CURLE_AGAIN;
    q_local = (bufq *)0xffffffffffffffff;
  }
  else {
    q_local = (bufq *)n;
  }
  return (ssize_t)q_local;
}

Assistant:

ssize_t Curl_bufq_read(struct bufq *q, unsigned char *buf, size_t len,
                       CURLcode *err)
{
  ssize_t nread = 0;
  size_t n;

  *err = CURLE_OK;
  while(len && q->head) {
    n = chunk_read(q->head, buf, len);
    if(n) {
      nread += n;
      buf += n;
      len -= n;
    }
    prune_head(q);
  }
  if(nread == 0) {
    *err = CURLE_AGAIN;
    return -1;
  }
  return nread;
}